

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicFalse_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicFalse_Test *this)

{
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicFalse)
{
    if( bool b = false )
        IUTEST_ASSERT_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_EXPECT_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_INFORM_FALSE(T<0, 0>::call(b)) << b;
    if( bool b = false )
        IUTEST_ASSUME_FALSE(T<0, 0>::call(b)) << b;
}